

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::MatchLiteralEquivInst::Exec
          (MatchLiteralEquivInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  char16_t *pcVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  Program *pPVar5;
  char16_t **ppcVar6;
  undefined4 *puVar7;
  uint local_54;
  CharCount literalEndOffset;
  CharCount literalOffset;
  Char *literalBuffer;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  MatchLiteralEquivInst *this_local;
  
  if (inputLength - *inputOffset < (this->super_LiteralMixin).length) {
    this_local._7_1_ =
         Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  else {
    pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&matcher->program);
    ppcVar6 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                        ((WriteBarrierPtr *)&(pPVar5->rep).insts.litbuf);
    pcVar1 = *ppcVar6;
    local_54 = (this->super_LiteralMixin).offset;
    uVar4 = (this->super_LiteralMixin).offset + (this->super_LiteralMixin).length * 4;
    pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&matcher->program);
    if ((pPVar5->rep).insts.litbufLen < uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x690,"(literalEndOffset <= matcher.program->rep.insts.litbufLen)",
                         "literalEndOffset <= matcher.program->rep.insts.litbufLen");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    do {
      Matcher::CompStats(matcher);
      if ((((input[*inputOffset] != pcVar1[local_54]) &&
           (input[*inputOffset] != pcVar1[local_54 + 1])) &&
          (input[*inputOffset] != pcVar1[local_54 + 2])) &&
         (input[*inputOffset] != pcVar1[local_54 + 3])) {
        bVar3 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks
                             );
        return bVar3;
      }
      *inputOffset = *inputOffset + 1;
      local_54 = local_54 + 4;
    } while (local_54 < uVar4);
    *instPointer = *instPointer + 9;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool MatchLiteralEquivInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (length > inputLength - inputOffset)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        const Char *const literalBuffer = matcher.program->rep.insts.litbuf;
        CharCount literalOffset = offset;
        const CharCount literalEndOffset = offset + length * CaseInsensitive::EquivClassSize;

        Assert(literalEndOffset <= matcher.program->rep.insts.litbufLen);
        CompileAssert(CaseInsensitive::EquivClassSize == 4);

        do
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            if (input[inputOffset] != literalBuffer[literalOffset]
                && input[inputOffset] != literalBuffer[literalOffset + 1]
                && input[inputOffset] != literalBuffer[literalOffset + 2]
                && input[inputOffset] != literalBuffer[literalOffset + 3])
            {
                return matcher.Fail(FAIL_PARAMETERS);
            }
            inputOffset++;
            literalOffset += CaseInsensitive::EquivClassSize;
        }
        while (literalOffset < literalEndOffset);

        instPointer += sizeof(*this);
        return false;
    }